

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

WhereNonZeroLayerParams * __thiscall
CoreML::Specification::WhereNonZeroLayerParams::New(WhereNonZeroLayerParams *this,Arena *arena)

{
  WhereNonZeroLayerParams *this_00;
  
  this_00 = (WhereNonZeroLayerParams *)operator_new(0x18);
  WhereNonZeroLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::WhereNonZeroLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

WhereNonZeroLayerParams* WhereNonZeroLayerParams::New(::google::protobuf::Arena* arena) const {
  WhereNonZeroLayerParams* n = new WhereNonZeroLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}